

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

Result * __thiscall Catch::Clara::Detail::ParserBase::validate(ParserBase *this)

{
  Result *in_RDI;
  
  BasicResult<void>::ok();
  return in_RDI;
}

Assistant:

virtual auto validate() const -> Result { return Result::ok(); }